

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O0

MPP_RET hal_h265e_v541_start(void *hal,HalEncTask *task)

{
  long lVar1;
  long lVar2;
  long local_78;
  MppDevRegRdCfg cfg1;
  MppDevRegWrCfg cfg;
  RK_U32 *regs;
  RK_U32 i;
  H265eV541IoctlOutputElem *reg_out;
  HalEncTask *enc_task;
  RK_U32 length;
  H265eV541HalContext *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x80);
  lVar2 = *(long *)((long)hal + 0x70);
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v541","(%d) enter\n",(char *)0x0,0x704);
  }
  if ((task->flags).err == 0) {
    vepu541_h265_set_l2_regs((H265eV541HalContext *)hal,*(H265eV54xL2RegSet **)((long)hal + 0x78));
    cfg1._8_8_ = *(undefined8 *)((long)hal + 0x70);
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),4,&cfg1.size);
    if (ctx._4_4_ == MPP_OK) {
      cfg1.reg._0_4_ = 4;
      cfg1.reg._4_4_ = 0x1c;
      local_78 = lVar1;
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&local_78);
      if (ctx._4_4_ == MPP_OK) {
        local_78 = lVar1 + 4;
        cfg1.reg._0_4_ = 0x134;
        cfg1.reg._4_4_ = 0x210;
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),5,&local_78);
        if (ctx._4_4_ == MPP_OK) {
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
          if (ctx._4_4_ != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v541","send cmd failed %d\n","hal_h265e_v541_start",
                       (ulong)(uint)ctx._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_h265e_v541","set register read failed %d\n","hal_h265e_v541_start",
                     (ulong)(uint)ctx._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h265e_v541","set register read failed %d\n","hal_h265e_v541_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_h265e_v541","set register write failed %d\n","hal_h265e_v541_start",
                 (ulong)(uint)ctx._4_4_);
    }
    for (regs._4_4_ = 0; regs._4_4_ < 0xd1; regs._4_4_ = regs._4_4_ + 1) {
      if ((hal_h265e_debug & 0x10) != 0) {
        _mpp_log_l(4,"hal_h265e_v541","set reg[%04d]: 0%08x\n",(char *)0x0,(ulong)regs._4_4_,
                   (ulong)*(uint *)(lVar2 + (ulong)regs._4_4_ * 4));
      }
    }
    if ((hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","vpu client is sending %d regs",(char *)0x0,0);
    }
    if ((hal_h265e_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","(%d) leave\n",(char *)0x0,0x73c);
    }
    hal_local._4_4_ = ctx._4_4_;
  }
  else {
    _mpp_log_l(2,"hal_h265e_v541","enc_task->flags.err %08x, return early","hal_h265e_v541_start",
               (ulong)(task->flags).err);
    hal_local._4_4_ = MPP_NOK;
  }
  return hal_local._4_4_;
}

Assistant:

MPP_RET hal_h265e_v541_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    H265eV541HalContext *ctx = (H265eV541HalContext *)hal;
    RK_U32 length = 0;
    HalEncTask *enc_task = task;
    H265eV541IoctlOutputElem *reg_out = (H265eV541IoctlOutputElem *)ctx->reg_out;
    RK_U32 i;
    RK_U32 *regs = (RK_U32*)ctx->regs;
    hal_h265e_enter();

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return early",
                      enc_task->flags.err);
        return MPP_NOK;
    }
    vepu541_h265_set_l2_regs(ctx, (H265eV54xL2RegSet*)ctx->l2_regs);

    do {
        MppDevRegWrCfg cfg;

        cfg.reg = ctx->regs;
        cfg.size = sizeof(H265eV541RegSet);
        cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        MppDevRegRdCfg cfg1;

        cfg1.reg = &reg_out->hw_status;
        cfg1.size = sizeof(RK_U32);
        cfg1.offset = VEPU541_REG_BASE_HW_STATUS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        cfg1.reg = &reg_out->st_bsl;
        cfg1.size = sizeof(H265eV541IoctlOutputElem) - 4;
        cfg1.offset = VEPU541_REG_BASE_STATISTICS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &cfg1);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    for (i = 0; i < sizeof(H265eV541RegSet) / 4; i++) {
        hal_h265e_dbg_regs("set reg[%04d]: 0%08x\n", i, regs[i]);
    }

    hal_h265e_dbg_detail("vpu client is sending %d regs", length);
    hal_h265e_leave();
    return ret;
}